

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::EmitAddtlInfo_SnapArrayBufferInfo(SnapObject *snpObject,FileWriter *writer)

{
  uint32 *puVar1;
  ulong uVar2;
  
  if (snpObject->SnapObjectTag != SnapArrayBufferObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
  FileWriter::WriteLengthValue(writer,*puVar1,CommaAndBigSpaceSeparator);
  if (*puVar1 != 0) {
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if (*puVar1 != 0) {
      uVar2 = 0;
      do {
        (*writer->_vptr_FileWriter[0xb])
                  (writer,(ulong)*(byte *)(*(long *)(puVar1 + 2) + uVar2),(ulong)(uVar2 != 0));
        uVar2 = uVar2 + 1;
      } while (uVar2 < *puVar1);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  return;
}

Assistant:

void EmitAddtlInfo_SnapArrayBufferInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapArrayBufferInfo* buffInfo = SnapObjectGetAddtlInfoAs<SnapArrayBufferInfo*, SnapObjectType::SnapArrayBufferObject>(snpObject);

            writer->WriteLengthValue(buffInfo->Length, NSTokens::Separator::CommaAndBigSpaceSeparator);

            if(buffInfo->Length > 0)
            {
                writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
                for(uint32 i = 0; i < buffInfo->Length; ++i)
                {
                    writer->WriteNakedByte(buffInfo->Buff[i], i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);
                }
                writer->WriteSequenceEnd();
            }
        }